

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::ProcessParam1BeforeParam2(IntersectNode *node1,IntersectNode *node2)

{
  long lVar1;
  long lVar2;
  TEdge *pTVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  lVar1 = (node2->pt).Y;
  lVar2 = (node1->pt).Y;
  if (lVar2 != lVar1) {
    return lVar1 < lVar2;
  }
  pTVar3 = node2->edge1;
  if ((node1->edge1 == pTVar3) || (node1->edge2 == pTVar3)) {
    lVar1 = (node2->pt).X;
    lVar2 = (node1->pt).X;
    if (pTVar3->dx <= 0.0) {
      return lVar2 < lVar1;
    }
    bVar6 = SBORROW8(lVar1,lVar2);
    lVar4 = lVar1 - lVar2;
    bVar5 = lVar1 == lVar2;
  }
  else {
    pTVar3 = node2->edge2;
    lVar1 = (node2->pt).X;
    lVar2 = (node1->pt).X;
    if (node1->edge1 != pTVar3 && node1->edge2 != pTVar3) {
      return lVar2 < lVar1;
    }
    if (pTVar3->dx <= 0.0) {
      return lVar2 < lVar1;
    }
    bVar6 = SBORROW8(lVar1,lVar2);
    lVar4 = lVar1 - lVar2;
    bVar5 = lVar1 == lVar2;
  }
  return bVar5 || bVar6 != lVar4 < 0;
}

Assistant:

bool ProcessParam1BeforeParam2(IntersectNode &node1, IntersectNode &node2)
{
  bool result;
  if (node1.pt.Y == node2.pt.Y)
  {
    if (node1.edge1 == node2.edge1 || node1.edge2 == node2.edge1)
    {
      result = node2.pt.X > node1.pt.X;
      return node2.edge1->dx > 0 ? !result : result;
    }
    else if (node1.edge1 == node2.edge2 || node1.edge2 == node2.edge2)
    {
      result = node2.pt.X > node1.pt.X;
      return node2.edge2->dx > 0 ? !result : result;
    }
    else return node2.pt.X > node1.pt.X;
  }
  else return node1.pt.Y > node2.pt.Y;
}